

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

int __thiscall VWReaderHandler<false>::init(VWReaderHandler<false> *this,EVP_PKEY_CTX *ctx)

{
  example **ppeVar1;
  InsituStringStream *in_RCX;
  v_array<example_*> *in_RDX;
  char *in_R8;
  example_factory_t in_R9;
  void *in_stack_00000008;
  
  Context<false>::init(&this->ctx,ctx);
  (this->ctx).examples = in_RDX;
  ppeVar1 = v_array<example_*>::operator[](in_RDX,0);
  (this->ctx).ex = *ppeVar1;
  (**(code **)(*(long *)(ctx + 8) + 0x338))(&((this->ctx).ex)->l);
  (this->ctx).stream = in_RCX;
  (this->ctx).stream_end = in_R8;
  (this->ctx).example_factory = in_R9;
  (this->ctx).example_factory_context = in_stack_00000008;
  return (int)this;
}

Assistant:

void init(vw* all, v_array<example*>* examples, rapidjson::InsituStringStream* stream, const char* stream_end,
      VW::example_factory_t example_factory, void* example_factory_context)
  {
    ctx.init(all);
    ctx.examples = examples;
    ctx.ex = (*examples)[0];
    all->p->lp.default_label(&ctx.ex->l);

    ctx.stream = stream;
    ctx.stream_end = stream_end;
    ctx.example_factory = example_factory;
    ctx.example_factory_context = example_factory_context;
  }